

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O0

void __thiscall zmq::session_base_t::start_connecting(session_base_t *this,bool wait_)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  options_t *poVar4;
  udp_engine_t *puVar5;
  int *piVar6;
  char *pcVar7;
  byte in_SIL;
  object_t *in_RDI;
  char *errstr;
  int rc;
  bool send;
  bool recv;
  udp_engine_t *engine;
  address_t *proxy_address;
  own_t *connecter;
  io_thread_t *io_thread;
  uint in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  own_t *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffe98;
  socks_connecter_t *in_stack_fffffffffffffea0;
  ctx_t *in_stack_fffffffffffffea8;
  udp_engine_t *this_00;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  undefined1 uVar8;
  options_t *in_stack_fffffffffffffeb8;
  session_base_t *in_stack_fffffffffffffec0;
  io_thread_t *in_stack_fffffffffffffec8;
  tcp_connecter_t *in_stack_fffffffffffffed0;
  options_t *in_stack_fffffffffffffed8;
  session_base_t *in_stack_fffffffffffffee0;
  options_t *poVar9;
  undefined8 in_stack_ffffffffffffff10;
  undefined1 inc_seqnum_;
  session_base_t *in_stack_ffffffffffffff18;
  session_base_t *in_stack_ffffffffffffff20;
  session_base_t *psVar10;
  allocator<char> local_59;
  string local_58 [39];
  undefined1 local_31;
  session_base_t *local_30;
  session_base_t *local_28;
  options_t *local_20;
  io_thread_t *local_18;
  byte local_9;
  
  inc_seqnum_ = (undefined1)((ulong)in_stack_ffffffffffffff10 >> 0x38);
  local_9 = in_SIL & 1;
  if ((((byte)in_RDI[0x3a]._tid ^ 0xff) & 1) != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_active",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
            ,0x261);
    fflush(_stderr);
    zmq_abort((char *)0x234d38);
  }
  local_18 = object_t::choose_io_thread
                       (&in_stack_fffffffffffffe90->super_object_t,
                        CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  if (local_18 == (io_thread_t *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","io_thread",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
            ,0x266);
    fflush(_stderr);
    zmq_abort((char *)0x234dae);
  }
  local_20 = (options_t *)0x0;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffe90,
                          (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  if (bVar1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      in_stack_ffffffffffffff18 = (session_base_t *)operator_new(0x50,(nothrow_t *)&std::nothrow);
      bVar1 = in_stack_ffffffffffffff18 != (session_base_t *)0x0;
      psVar10 = (session_base_t *)0x0;
      if (bVar1) {
        local_31 = 1;
        inc_seqnum_ = (undefined1)((ulong)&local_59 >> 0x38);
        local_30 = in_stack_ffffffffffffff18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,
                   (allocator<char> *)in_stack_fffffffffffffec0);
        object_t::get_ctx(in_RDI);
        address_t::address_t
                  ((address_t *)in_stack_fffffffffffffec0,(string *)in_stack_fffffffffffffeb8,
                   (string *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                   in_stack_fffffffffffffea8);
        psVar10 = in_stack_ffffffffffffff18;
      }
      uVar8 = (undefined1)((ulong)in_stack_fffffffffffffec0 >> 0x38);
      local_31 = 0;
      in_stack_ffffffffffffff20 = psVar10;
      if (bVar1) {
        std::__cxx11::string::~string(local_58);
        std::allocator<char>::~allocator(&local_59);
      }
      local_28 = psVar10;
      if (psVar10 == (session_base_t *)0x0) {
        fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
                ,0x26f);
        fflush(_stderr);
        zmq_abort((char *)0x234fa6);
      }
      poVar4 = (options_t *)operator_new(0xb98,(nothrow_t *)&std::nothrow);
      poVar9 = (options_t *)0x0;
      if (poVar4 != (options_t *)0x0) {
        in_stack_fffffffffffffe88 = local_9 & 1;
        socks_connecter_t::socks_connecter_t
                  ((socks_connecter_t *)0x0,(io_thread_t *)poVar4,in_stack_fffffffffffffee0,
                   in_stack_fffffffffffffed8,(address_t *)in_stack_fffffffffffffed0,
                   (address_t *)in_stack_fffffffffffffec8,(bool)uVar8);
        poVar9 = poVar4;
      }
      local_20 = poVar9;
      if (poVar9 == (options_t *)0x0) {
        fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
                ,0x272);
        fflush(_stderr);
        zmq_abort((char *)0x23511f);
      }
      uVar3 = std::__cxx11::string::empty();
      poVar9 = local_20;
      if ((uVar3 & 1) == 0) {
        socks_connecter_t::set_auth_method_basic
                  (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                   (string *)in_stack_fffffffffffffe90);
        poVar9 = local_20;
      }
    }
    else {
      poVar4 = (options_t *)operator_new(0x5d0,(nothrow_t *)&std::nothrow);
      poVar9 = (options_t *)0x0;
      if (poVar4 != (options_t *)0x0) {
        tcp_connecter_t::tcp_connecter_t
                  (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8,
                   (address_t *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                   SUB81((ulong)in_stack_fffffffffffffea8 >> 0x38,0));
        poVar9 = poVar4;
      }
    }
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffe90,
                            (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    uVar8 = (undefined1)((ulong)in_stack_fffffffffffffea8 >> 0x38);
    if (bVar1) {
      poVar4 = (options_t *)operator_new(0x5c8,(nothrow_t *)&std::nothrow);
      poVar9 = (options_t *)0x0;
      if (poVar4 != (options_t *)0x0) {
        ipc_connecter_t::ipc_connecter_t
                  ((ipc_connecter_t *)0x0,(io_thread_t *)poVar4,in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8,
                   (address_t *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                   (bool)uVar8);
        poVar9 = poVar4;
      }
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffe90,
                              (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88))
      ;
      poVar9 = local_20;
      if (bVar1) {
        poVar4 = (options_t *)operator_new(0x5c8,(nothrow_t *)&std::nothrow);
        poVar9 = (options_t *)0x0;
        if (poVar4 != (options_t *)0x0) {
          tipc_connecter_t::tipc_connecter_t
                    ((tipc_connecter_t *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                     (session_base_t *)0x0,poVar4,
                     (address_t *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                     (bool)uVar8);
          poVar9 = poVar4;
        }
      }
    }
  }
  local_20 = poVar9;
  if (local_20 == (options_t *)0x0) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffe90,
                            (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    if (bVar1) {
      uVar8 = true;
      if ((in_RDI[0xd].field_0x14 != '\x0f') && (uVar8 = true, in_RDI[0xd].field_0x14 != '\x0e')) {
        uVar8 = in_RDI[0xd].field_0x14 == '\x12';
      }
      if (((uVar8 ^ 0xff) & 1) != 0) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "options.type == ZMQ_DISH || options.type == ZMQ_RADIO || options.type == ZMQ_DGRAM"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
                ,0x2a3);
        fflush(_stderr);
        zmq_abort((char *)0x23559c);
      }
      puVar5 = (udp_engine_t *)operator_new(0x4598,(nothrow_t *)&std::nothrow);
      this_00 = (udp_engine_t *)0x0;
      if (puVar5 != (udp_engine_t *)0x0) {
        udp_engine_t::udp_engine_t
                  ((udp_engine_t *)CONCAT17(uVar8,in_stack_fffffffffffffeb0),(options_t *)0x0);
        this_00 = puVar5;
      }
      if (this_00 == (udp_engine_t *)0x0) {
        fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
                ,0x2a6);
        fflush(_stderr);
        zmq_abort((char *)0x235660);
      }
      iVar2 = udp_engine_t::init(this_00,(EVP_PKEY_CTX *)in_RDI[0x3f]._ctx);
      if (iVar2 != 0) {
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        fprintf(_stderr,"%s (%s:%d)\n",pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
                ,0x2b7);
        fflush(_stderr);
        zmq_abort((char *)0x2357cd);
      }
      object_t::send_attach
                (in_RDI,in_stack_ffffffffffffff20,(i_engine *)in_stack_ffffffffffffff18,
                 (bool)inc_seqnum_);
    }
    else {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","false",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
              ,0x306);
      fflush(_stderr);
      zmq_abort((char *)0x23585c);
    }
  }
  else {
    if (local_20 == (options_t *)0x0) {
      fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
              ,0x29c);
      fflush(_stderr);
      zmq_abort((char *)0x2354ba);
    }
    own_t::launch_child(in_stack_fffffffffffffe90,
                        (own_t *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  }
  return;
}

Assistant:

void zmq::session_base_t::start_connecting (bool wait_)
{
    zmq_assert (_active);

    //  Choose I/O thread to run connecter in. Given that we are already
    //  running in an I/O thread, there must be at least one available.
    io_thread_t *io_thread = choose_io_thread (options.affinity);
    zmq_assert (io_thread);

    //  Create the connecter object.
    own_t *connecter = NULL;
    if (_addr->protocol == protocol_name::tcp) {
        if (!options.socks_proxy_address.empty ()) {
            address_t *proxy_address = new (std::nothrow)
              address_t (protocol_name::tcp, options.socks_proxy_address,
                         this->get_ctx ());
            alloc_assert (proxy_address);
            connecter = new (std::nothrow) socks_connecter_t (
              io_thread, this, options, _addr, proxy_address, wait_);
            alloc_assert (connecter);
            if (!options.socks_proxy_username.empty ()) {
                reinterpret_cast<socks_connecter_t *> (connecter)
                  ->set_auth_method_basic (options.socks_proxy_username,
                                           options.socks_proxy_password);
            }
        } else {
            connecter = new (std::nothrow)
              tcp_connecter_t (io_thread, this, options, _addr, wait_);
        }
    }
#if defined ZMQ_HAVE_IPC
    else if (_addr->protocol == protocol_name::ipc) {
        connecter = new (std::nothrow)
          ipc_connecter_t (io_thread, this, options, _addr, wait_);
    }
#endif
#if defined ZMQ_HAVE_TIPC
    else if (_addr->protocol == protocol_name::tipc) {
        connecter = new (std::nothrow)
          tipc_connecter_t (io_thread, this, options, _addr, wait_);
    }
#endif
#if defined ZMQ_HAVE_VMCI
    else if (_addr->protocol == protocol_name::vmci) {
        connecter = new (std::nothrow)
          vmci_connecter_t (io_thread, this, options, _addr, wait_);
    }
#endif
#if defined ZMQ_HAVE_WS
    else if (_addr->protocol == protocol_name::ws) {
        connecter = new (std::nothrow) ws_connecter_t (
          io_thread, this, options, _addr, wait_, false, std::string ());
    }
#endif
#if defined ZMQ_HAVE_WSS
    else if (_addr->protocol == protocol_name::wss) {
        connecter = new (std::nothrow) ws_connecter_t (
          io_thread, this, options, _addr, wait_, true, _wss_hostname);
    }
#endif
    if (connecter != NULL) {
        alloc_assert (connecter);
        launch_child (connecter);
        return;
    }

    if (_addr->protocol == protocol_name::udp) {
        zmq_assert (options.type == ZMQ_DISH || options.type == ZMQ_RADIO
                    || options.type == ZMQ_DGRAM);

        udp_engine_t *engine = new (std::nothrow) udp_engine_t (options);
        alloc_assert (engine);

        bool recv = false;
        bool send = false;

        if (options.type == ZMQ_RADIO) {
            send = true;
            recv = false;
        } else if (options.type == ZMQ_DISH) {
            send = false;
            recv = true;
        } else if (options.type == ZMQ_DGRAM) {
            send = true;
            recv = true;
        }

        int rc = engine->init (_addr, send, recv);
        errno_assert (rc == 0);

        send_attach (this, engine);

        return;
    }

#ifdef ZMQ_HAVE_OPENPGM

    //  Both PGM and EPGM transports are using the same infrastructure.
    if (_addr->protocol == "pgm" || _addr->protocol == "epgm") {
        zmq_assert (options.type == ZMQ_PUB || options.type == ZMQ_XPUB
                    || options.type == ZMQ_SUB || options.type == ZMQ_XSUB);

        //  For EPGM transport with UDP encapsulation of PGM is used.
        bool const udp_encapsulation = _addr->protocol == "epgm";

        //  At this point we'll create message pipes to the session straight
        //  away. There's no point in delaying it as no concept of 'connect'
        //  exists with PGM anyway.
        if (options.type == ZMQ_PUB || options.type == ZMQ_XPUB) {
            //  PGM sender.
            pgm_sender_t *pgm_sender =
              new (std::nothrow) pgm_sender_t (io_thread, options);
            alloc_assert (pgm_sender);

            int rc =
              pgm_sender->init (udp_encapsulation, _addr->address.c_str ());
            errno_assert (rc == 0);

            send_attach (this, pgm_sender);
        } else {
            //  PGM receiver.
            pgm_receiver_t *pgm_receiver =
              new (std::nothrow) pgm_receiver_t (io_thread, options);
            alloc_assert (pgm_receiver);

            int rc =
              pgm_receiver->init (udp_encapsulation, _addr->address.c_str ());
            errno_assert (rc == 0);

            send_attach (this, pgm_receiver);
        }

        return;
    }
#endif

#ifdef ZMQ_HAVE_NORM
    if (_addr->protocol == "norm") {
        //  At this point we'll create message pipes to the session straight
        //  away. There's no point in delaying it as no concept of 'connect'
        //  exists with NORM anyway.
        if (options.type == ZMQ_PUB || options.type == ZMQ_XPUB) {
            //  NORM sender.
            norm_engine_t *norm_sender =
              new (std::nothrow) norm_engine_t (io_thread, options);
            alloc_assert (norm_sender);

            int rc = norm_sender->init (_addr->address.c_str (), true, false);
            errno_assert (rc == 0);

            send_attach (this, norm_sender);
        } else { // ZMQ_SUB or ZMQ_XSUB

            //  NORM receiver.
            norm_engine_t *norm_receiver =
              new (std::nothrow) norm_engine_t (io_thread, options);
            alloc_assert (norm_receiver);

            int rc = norm_receiver->init (_addr->address.c_str (), false, true);
            errno_assert (rc == 0);

            send_attach (this, norm_receiver);
        }
        return;
    }
#endif // ZMQ_HAVE_NORM

    zmq_assert (false);
}